

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O0

void __thiscall
SuiteMessageTests::TestmassQuoteParseGetString::RunImpl(TestmassQuoteParseGetString *this)

{
  TestResults *results;
  TestResults **ppTVar1;
  TestDetails **ppTVar2;
  TestDetails local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  allocator<char> local_471;
  DATA local_470;
  EncodedUnderlyingSecurityDesc local_450;
  LENGTH local_3ec;
  EncodedUnderlyingSecurityDescLen local_3e8;
  allocator<char> local_381;
  STRING local_380;
  UnderlyingSymbol local_360;
  allocator<char> local_2f9;
  STRING local_2f8;
  QuoteSetID local_2d8;
  undefined1 local_278 [8];
  NoQuoteSets group;
  allocator<char> local_1e9;
  STRING local_1e8;
  QuoteID local_1c8;
  undefined1 local_168 [8];
  MassQuote object;
  TestmassQuoteParseGetString *this_local;
  
  object.super_Message._336_8_ = this;
  FIX42::MassQuote::MassQuote((MassQuote *)local_168);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e8,"1",&local_1e9);
  FIX::QuoteID::QuoteID(&local_1c8,&local_1e8);
  FIX42::MassQuote::set((MassQuote *)local_168,&local_1c8);
  FIX::QuoteID::~QuoteID(&local_1c8);
  std::__cxx11::string::~string((string *)&local_1e8);
  std::allocator<char>::~allocator(&local_1e9);
  FIX42::MassQuote::NoQuoteSets::NoQuoteSets((NoQuoteSets *)local_278);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"A",&local_2f9);
  FIX::QuoteSetID::QuoteSetID(&local_2d8,&local_2f8);
  FIX42::MassQuote::NoQuoteSets::set((NoQuoteSets *)local_278,&local_2d8);
  FIX::QuoteSetID::~QuoteSetID(&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_380,"DELL",&local_381);
  FIX::UnderlyingSymbol::UnderlyingSymbol(&local_360,&local_380);
  FIX42::MassQuote::NoQuoteSets::set((NoQuoteSets *)local_278,&local_360);
  FIX::UnderlyingSymbol::~UnderlyingSymbol(&local_360);
  std::__cxx11::string::~string((string *)&local_380);
  std::allocator<char>::~allocator(&local_381);
  local_3ec = 10;
  FIX::EncodedUnderlyingSecurityDescLen::EncodedUnderlyingSecurityDescLen(&local_3e8,&local_3ec);
  FIX42::MassQuote::NoQuoteSets::set((NoQuoteSets *)local_278,&local_3e8);
  FIX::EncodedUnderlyingSecurityDescLen::~EncodedUnderlyingSecurityDescLen(&local_3e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"DELL\x01COMP\x01",&local_471);
  FIX::EncodedUnderlyingSecurityDesc::EncodedUnderlyingSecurityDesc(&local_450,&local_470);
  FIX42::MassQuote::NoQuoteSets::set((NoQuoteSets *)local_278,&local_450);
  FIX::EncodedUnderlyingSecurityDesc::~EncodedUnderlyingSecurityDesc(&local_450);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  FIX::Message::addGroup((Message *)local_168,(Group *)local_278);
  ppTVar1 = UnitTest::CurrentTest::Results();
  results = *ppTVar1;
  FIX::Message::toString_abi_cxx11_((int)&local_498,(int)local_168,8);
  ppTVar2 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_4b8,*ppTVar2,0x4a5);
  UnitTest::CheckEqual<char[77],std::__cxx11::string>
            (results,(char (*) [77])
                     "8=FIX.4.2\x019=54\x0135=i\x01117=1\x01296=1\x01302=A\x01311=DELL\x01364=10\x01365=DELL\x01COMP\x01\x0110=152\x01"
             ,&local_498,&local_4b8);
  std::__cxx11::string::~string((string *)&local_498);
  FIX42::MassQuote::NoQuoteSets::~NoQuoteSets((NoQuoteSets *)local_278);
  FIX42::MassQuote::~MassQuote((MassQuote *)local_168);
  return;
}

Assistant:

TEST(massQuoteParseGetString)
{
  MassQuote object;

  object.set( QuoteID( "1" ) );

  MassQuote::NoQuoteSets group;
  group.set( QuoteSetID( "A" ) );
  group.set( UnderlyingSymbol( "DELL" ) );
  group.set( EncodedUnderlyingSecurityDescLen( 10 ) );
  group.set( EncodedUnderlyingSecurityDesc( "DELL\001COMP\001" ) );
  object.addGroup( group );

  CHECK_EQUAL(
          ( "8=FIX.4.2\0019=54\00135=i\001117=1\001296=1\001302=A\001"
            "311=DELL\001364=10\001365=DELL\001COMP\001\00110=152\001" ), object.toString() );
}